

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

config * Configtable_find(config *key)

{
  s_x4node *psVar1;
  int iVar2;
  config *_a;
  s_x4node **ppsVar3;
  
  if (x4a == (s_x4 *)0x0) {
LAB_00103adb:
    _a = (config *)0x0;
  }
  else {
    ppsVar3 = x4a->ht + ((long)(key->rp->index * 0x25 + key->dot) & (long)x4a->size - 1U);
    do {
      psVar1 = *ppsVar3;
      if (psVar1 == (s_x4node *)0x0) goto LAB_00103adb;
      _a = psVar1->data;
      iVar2 = Configcmp((char *)_a,(char *)key);
      ppsVar3 = &psVar1->next;
    } while (iVar2 != 0);
  }
  return _a;
}

Assistant:

struct config *Configtable_find(struct config *key)
{
  int h;
  x4node *np;

  if( x4a==0 ) return 0;
  h = confighash(key) & (x4a->size-1);
  np = x4a->ht[h];
  while( np ){
    if( Configcmp((const char *) np->data,(const char *) key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}